

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O0

void __thiscall
xLearn::MODEL_TEST_Init_fm_Test::~MODEL_TEST_Init_fm_Test(MODEL_TEST_Init_fm_Test *this)

{
  void *in_RDI;
  
  ~MODEL_TEST_Init_fm_Test((MODEL_TEST_Init_fm_Test *)0x142808);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(MODEL_TEST, Init_fm) {
  HyperParam hyper_param = Init();
  hyper_param.score_func = "fm";
  Model model_fm;
  model_fm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 
                    hyper_param.auxiliary_size, 
                    0.5);
  real_t* b = model_fm.GetParameter_b();
  real_t* w = model_fm.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_fm.GetParameter_v();
  index_t param_num_v = hyper_param.num_feature *
                        hyper_param.num_K * 2;
  EXPECT_EQ(param_num_w, model_fm.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_fm.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_fm.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t len = model_fm.GetNumParameter_w();
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < len; i+=aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }
  }
  index_t k_aligned = model_fm.get_aligned_k();
  for (index_t i = k_aligned; i < param_num_v; i+=(aux_size*k_aligned)) {
    EXPECT_FLOAT_EQ(v[i], 1.0);
  }
}